

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O0

idx_t duckdb::DistinctSelectGenericLoopSwitch<float,float,duckdb::DistinctFrom>
                (float *ldata,float *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lmask,ValidityMask *rmask,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  SelectionVector *in_RCX;
  float *in_RDX;
  float *in_RSI;
  SelectionVector *in_R8;
  SelectionVector *in_R9;
  ValidityMask *unaff_retaddr;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  SelectionVector *in_stack_00000018;
  idx_t in_stack_ffffffffffffffb8;
  idx_t local_10;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar1))
  {
    local_10 = DistinctSelectGenericLoopSelSwitch<float,float,duckdb::DistinctFrom,true>
                         (in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb8,unaff_retaddr,
                          (ValidityMask *)in_stack_00000008,(SelectionVector *)in_stack_00000010,
                          in_stack_00000018);
  }
  else {
    local_10 = DistinctSelectGenericLoopSelSwitch<float,float,duckdb::DistinctFrom,false>
                         (in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb8,unaff_retaddr,
                          (ValidityMask *)in_stack_00000008,(SelectionVector *)in_stack_00000010,
                          in_stack_00000018);
  }
  return local_10;
}

Assistant:

static inline idx_t
DistinctSelectGenericLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
                                const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
                                const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lmask,
                                ValidityMask &rmask, SelectionVector *true_sel, SelectionVector *false_sel) {
#ifndef DUCKDB_SMALLER_BINARY
	if (!lmask.AllValid() || !rmask.AllValid()) {
		return DistinctSelectGenericLoopSelSwitch<LEFT_TYPE, RIGHT_TYPE, OP, false>(
		    ldata, rdata, lsel, rsel, result_sel, count, lmask, rmask, true_sel, false_sel);
	} else {
		return DistinctSelectGenericLoopSelSwitch<LEFT_TYPE, RIGHT_TYPE, OP, true>(
		    ldata, rdata, lsel, rsel, result_sel, count, lmask, rmask, true_sel, false_sel);
	}
#else
	return DistinctSelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP>(ldata, rdata, lsel, rsel, result_sel, count, lmask,
	                                                            rmask, true_sel, false_sel);
#endif
}